

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O0

opj_image_t *
pngtoimage_internal(opj_cparameters_t *params,FILE *reader,png_structp png,png_infop info,
                   png_uint_32 *pheight,OPJ_BYTE ***prows,OPJ_INT32 **prow32s)

{
  convert_32s_CXPX p_Var1;
  byte bVar2;
  int iVar3;
  __jmp_buf_tag *__env;
  OPJ_BYTE **ppOVar4;
  size_t __size;
  OPJ_BYTE *pOVar5;
  OPJ_INT32 **ppOVar6;
  undefined8 uVar7;
  OPJ_INT32 *row32s;
  OPJ_BYTE **rows;
  int color_type;
  png_uint_32 height;
  png_uint_32 width;
  OPJ_UINT32 i;
  int filter_type;
  int compression_type;
  int interlace_type;
  int bit_depth;
  double gamma;
  OPJ_INT32 *planes [4];
  convert_32s_CXPX cvtCxToPx;
  convert_XXx32s_C1R cvtXXTo32s;
  int local_d8;
  OPJ_UINT32 nr_comp;
  opj_image_cmptparm_t cmptparm [4];
  opj_image_t *image;
  OPJ_BYTE ***prows_local;
  png_uint_32 *pheight_local;
  png_infop info_local;
  png_structp png_local;
  FILE *reader_local;
  opj_cparameters_t *params_local;
  
  *pheight = 0;
  *prows = (OPJ_BYTE **)0x0;
  *prow32s = (OPJ_INT32 *)0x0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar3 = _setjmp(__env);
  if (iVar3 == 0) {
    cmptparm[3].bpp = 0;
    cmptparm[3].sgnd = 0;
    rows._4_4_ = 0;
    png_init_io(png,reader);
    png_set_sig_bytes(png,8);
    png_read_info(png,info);
    iVar3 = png_get_IHDR(png,info,&color_type,(long)&rows + 4,&compression_type,&rows,&filter_type,
                         &i,&width);
    if (iVar3 == 0) {
      params_local = (opj_cparameters_t *)cmptparm[3]._28_8_;
    }
    else {
      *pheight = rows._4_4_;
      if ((uint)rows == 3) {
        png_set_expand(png);
      }
      iVar3 = png_get_valid(png,info,0x10);
      if (iVar3 != 0) {
        png_set_expand(png);
      }
      iVar3 = png_get_gAMA(png,info,&interlace_type);
      if (iVar3 == 0) {
        _interlace_type = 0x3ff0000000000000;
      }
      png_set_gamma(0x3ff0000000000000,_interlace_type,png);
      png_read_update_info(png,info);
      bVar2 = png_get_color_type(png,info);
      rows._0_4_ = (uint)bVar2;
      switch((uint)rows) {
      case 0:
        cvtXXTo32s._4_4_ = 1;
        break;
      default:
        fprintf(_stderr,"pngtoimage: colortype %d is not supported\n",(ulong)(uint)rows);
        return (opj_image_t *)cmptparm[3]._28_8_;
      case 2:
        cvtXXTo32s._4_4_ = 3;
        break;
      case 4:
        cvtXXTo32s._4_4_ = 2;
        break;
      case 6:
        cvtXXTo32s._4_4_ = 4;
      }
      p_Var1 = convert_32s_CXPX_LUT[cvtXXTo32s._4_4_];
      bVar2 = png_get_bit_depth(png,info);
      compression_type = (int)bVar2;
      if (((compression_type - 1U < 2) || (compression_type == 4)) || (compression_type == 8)) {
        cvtCxToPx = (convert_32s_CXPX)convert_XXu32s_C1R_LUT[compression_type];
      }
      else {
        if (compression_type != 0x10) {
          fprintf(_stderr,"pngtoimage: bit depth %d is not supported\n",
                  (ulong)(uint)compression_type);
          return (opj_image_t *)cmptparm[3]._28_8_;
        }
        cvtCxToPx = convert_16u32s_C1R;
      }
      ppOVar4 = (OPJ_BYTE **)calloc((ulong)(rows._4_4_ + 1),8);
      if (ppOVar4 == (OPJ_BYTE **)0x0) {
        fprintf(_stderr,"pngtoimage: memory out\n");
        params_local = (opj_cparameters_t *)cmptparm[3]._28_8_;
      }
      else {
        *prows = ppOVar4;
        for (height = 0; height < rows._4_4_; height = height + 1) {
          __size = png_get_rowbytes(png,info);
          pOVar5 = (OPJ_BYTE *)malloc(__size);
          ppOVar4[height] = pOVar5;
          if (ppOVar4[height] == (OPJ_BYTE *)0x0) {
            fprintf(_stderr,"pngtoimage: memory out\n");
            return (opj_image_t *)cmptparm[3]._28_8_;
          }
        }
        png_read_image(png);
        memset(&local_d8,0,0x90);
        for (height = 0; height < cvtXXTo32s._4_4_; height = height + 1) {
          cmptparm[height].x0 = compression_type;
          cmptparm[height].prec = 0;
          (&local_d8)[(ulong)height * 9] = params->subsampling_dx;
          cmptparm[(ulong)height - 1].sgnd = params->subsampling_dy;
          cmptparm[height].dx = color_type;
          cmptparm[height].dy = rows._4_4_;
        }
        uVar7 = 2;
        if (2 < cvtXXTo32s._4_4_) {
          uVar7 = 1;
        }
        cmptparm[3]._28_8_ = opj_image_create(cvtXXTo32s._4_4_,&local_d8,uVar7);
        params_local = (opj_cparameters_t *)cmptparm[3]._28_8_;
        if ((opj_cparameters_t *)cmptparm[3]._28_8_ != (opj_cparameters_t *)0x0) {
          ((opj_cparameters_t *)cmptparm[3]._28_8_)->tile_size_on = params->image_offset_x0;
          ((opj_cparameters_t *)cmptparm[3]._28_8_)->cp_tx0 = params->image_offset_y0;
          ((opj_cparameters_t *)cmptparm[3]._28_8_)->cp_ty0 =
               ((opj_cparameters_t *)cmptparm[3]._28_8_)->tile_size_on +
               (color_type + -1) * params->subsampling_dx + 1;
          ((opj_cparameters_t *)cmptparm[3]._28_8_)->cp_tdx =
               ((opj_cparameters_t *)cmptparm[3]._28_8_)->cp_tx0 +
               (rows._4_4_ - 1) * params->subsampling_dy + 1;
          ppOVar6 = (OPJ_INT32 **)malloc((ulong)(uint)color_type * (ulong)cvtXXTo32s._4_4_ * 4);
          if (ppOVar6 == (OPJ_INT32 **)0x0) {
            params_local = (opj_cparameters_t *)cmptparm[3]._28_8_;
          }
          else {
            *prow32s = (OPJ_INT32 *)ppOVar6;
            *(ushort *)
             (*(long *)(cmptparm[3]._28_8_ + 0x18) + (ulong)(cvtXXTo32s._4_4_ - 1) * 0x40 + 0x38) =
                 1 - ((ushort)cvtXXTo32s._4_4_ & 1);
            for (height = 0; height < cvtXXTo32s._4_4_; height = height + 1) {
              planes[(ulong)height - 1] =
                   *(OPJ_INT32 **)
                    (*(long *)(cmptparm[3]._28_8_ + 0x18) + (ulong)height * 0x40 + 0x30);
            }
            for (height = 0; height < rows._4_4_; height = height + 1) {
              (*cvtCxToPx)((OPJ_INT32 *)ppOVar4[height],ppOVar6,
                           (ulong)(uint)color_type * (ulong)cvtXXTo32s._4_4_);
              (*p_Var1)((OPJ_INT32 *)ppOVar6,(OPJ_INT32 **)&gamma,(OPJ_SIZE_T)color_type);
              gamma = (double)((long)gamma + (ulong)(uint)color_type * 4);
              planes[0] = planes[0] + (uint)color_type;
              planes[1] = planes[1] + (uint)color_type;
              planes[2] = planes[2] + (uint)color_type;
            }
            params_local = (opj_cparameters_t *)cmptparm[3]._28_8_;
          }
        }
      }
    }
  }
  else {
    params_local = (opj_cparameters_t *)0x0;
  }
  return (opj_image_t *)params_local;
}

Assistant:

static opj_image_t * pngtoimage_internal(opj_cparameters_t * params,
        FILE *reader,
        png_structp  png,
        png_infop    info,
        png_uint_32* pheight,
        OPJ_BYTE*** prows,
        OPJ_INT32** prow32s)
{
    *pheight = 0;
    *prows = NULL;
    *prow32s = NULL;

    if (setjmp(png_jmpbuf(png))) {
        return NULL;
    }

    {
        opj_image_t *image = NULL;
        opj_image_cmptparm_t cmptparm[4];
        OPJ_UINT32 nr_comp;
        convert_XXx32s_C1R cvtXXTo32s = NULL;
        convert_32s_CXPX cvtCxToPx = NULL;
        OPJ_INT32* planes[4];
        double gamma;
        int bit_depth, interlace_type, compression_type, filter_type;
        OPJ_UINT32 i;
        png_uint_32  width, height = 0U;
        int color_type;
        OPJ_BYTE** rows = NULL;
        OPJ_INT32* row32s = NULL;

        png_init_io(png, reader);
        png_set_sig_bytes(png, MAGIC_SIZE);

        png_read_info(png, info);

        if (png_get_IHDR(png, info, &width, &height,
                         &bit_depth, &color_type, &interlace_type,
                         &compression_type, &filter_type) == 0) {
            return image;
        }
        *pheight = height;

        /* png_set_expand():
         * expand paletted images to RGB, expand grayscale images of
         * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
         * to alpha channels.
         */
        if (color_type == PNG_COLOR_TYPE_PALETTE) {
            png_set_expand(png);
        }

        if (png_get_valid(png, info, PNG_INFO_tRNS)) {
            png_set_expand(png);
        }
        /* We might want to expand background */
        /*
        if(png_get_valid(png, info, PNG_INFO_bKGD)) {
            png_color_16p bgnd;
            png_get_bKGD(png, info, &bgnd);
            png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
        }
        */

        if (!png_get_gAMA(png, info, &gamma)) {
            gamma = 1.0;
        }

        /* we're not displaying but converting, screen gamma == 1.0 */
        png_set_gamma(png, 1.0, gamma);

        png_read_update_info(png, info);

        color_type = png_get_color_type(png, info);

        switch (color_type) {
        case PNG_COLOR_TYPE_GRAY:
            nr_comp = 1;
            break;
        case PNG_COLOR_TYPE_GRAY_ALPHA:
            nr_comp = 2;
            break;
        case PNG_COLOR_TYPE_RGB:
            nr_comp = 3;
            break;
        case PNG_COLOR_TYPE_RGB_ALPHA:
            nr_comp = 4;
            break;
        default:
            fprintf(stderr, "pngtoimage: colortype %d is not supported\n", color_type);
            return image;
        }
        cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
        bit_depth = png_get_bit_depth(png, info);

        switch (bit_depth) {
        case 1:
        case 2:
        case 4:
        case 8:
            cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
            break;
        case 16: /* 16 bpp is specific to PNG */
            cvtXXTo32s = convert_16u32s_C1R;
            break;
        default:
            fprintf(stderr, "pngtoimage: bit depth %d is not supported\n", bit_depth);
            return image;
        }

        rows = (OPJ_BYTE**)calloc(height + 1, sizeof(OPJ_BYTE*));
        if (rows == NULL) {
            fprintf(stderr, "pngtoimage: memory out\n");
            return image;
        }
        *prows = rows;
        for (i = 0; i < height; ++i) {
            rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png, info));
            if (rows[i] == NULL) {
                fprintf(stderr, "pngtoimage: memory out\n");
                return image;
            }
        }
        png_read_image(png, rows);

        /* Create image */
        memset(cmptparm, 0, sizeof(cmptparm));
        for (i = 0; i < nr_comp; ++i) {
            /* bits_per_pixel: 8 or 16 */
            cmptparm[i].prec = (OPJ_UINT32)bit_depth;
            cmptparm[i].sgnd = 0;
            cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
            cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
            cmptparm[i].w = (OPJ_UINT32)width;
            cmptparm[i].h = (OPJ_UINT32)height;
        }

        image = opj_image_create(nr_comp, &cmptparm[0],
                                 (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
        if (image == NULL) {
            return image;
        }
        image->x0 = (OPJ_UINT32)params->image_offset_x0;
        image->y0 = (OPJ_UINT32)params->image_offset_y0;
        image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)
                                 params->subsampling_dx + 1);
        image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)
                                 params->subsampling_dy + 1);

        row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
        if (row32s == NULL) {
            return image;
        }
        *prow32s = row32s;

        /* Set alpha channel */
        image->comps[nr_comp - 1U].alpha = 1U - (nr_comp & 1U);

        for (i = 0; i < nr_comp; i++) {
            planes[i] = image->comps[i].data;
        }

        for (i = 0; i < height; ++i) {
            cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
            cvtCxToPx(row32s, planes, width);
            planes[0] += width;
            planes[1] += width;
            planes[2] += width;
            planes[3] += width;
        }

        return image;
    }
}